

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

void ncnn_net_destroy(ncnn_net_t net)

{
  void *pvVar1;
  long *in_RDI;
  ncnn_net_custom_layer_factory_t_conflict ud_next;
  ncnn_net_custom_layer_factory_t_conflict ud;
  void *local_10;
  
  if ((long *)*in_RDI != (long *)0x0) {
    (**(code **)(*(long *)*in_RDI + 8))();
  }
  local_10 = (void *)in_RDI[1];
  while (local_10 != (void *)0x0) {
    pvVar1 = *(void **)((long)local_10 + 0x18);
    free(local_10);
    local_10 = pvVar1;
  }
  free(in_RDI);
  return;
}

Assistant:

void ncnn_net_destroy(ncnn_net_t net)
{
    delete (Net*)net->pthis;
    ncnn_net_custom_layer_factory_t ud = net->custom_layer_factory;
    while (ud)
    {
        ncnn_net_custom_layer_factory_t ud_next = ud->next;
        free(ud);
        ud = ud_next;
    }
    free(net);
}